

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_enc.c
# Opt level: O2

void rlvl_destroy(jpc_enc_rlvl_t *rlvl)

{
  jpc_enc_band_t *band;
  ulong uVar1;
  
  band = rlvl->bands;
  if (band != (jpc_enc_band_t *)0x0) {
    for (uVar1 = 0; uVar1 < rlvl->numbands; uVar1 = uVar1 + 1) {
      band_destroy(band);
      band = band + 1;
    }
    jas_free(rlvl->bands);
    rlvl->bands = (jpc_enc_band_t *)0x0;
  }
  return;
}

Assistant:

static void rlvl_destroy(jpc_enc_rlvl_t *rlvl)
{
	jpc_enc_band_t *band;
	uint_fast16_t bandno;

	if (rlvl->bands) {
		for (bandno = 0, band = rlvl->bands; bandno < rlvl->numbands;
		  ++bandno, ++band) {
			band_destroy(band);
		}
		jas_free(rlvl->bands);
		rlvl->bands = NULL;
	}
}